

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * lua_getlocal(lua_State *L,lua_Debug *ar,int n)

{
  StkId pTVar1;
  int iVar2;
  undefined4 uVar3;
  char *pcVar4;
  StkId pos;
  StkId local_20;
  
  swapextra(L);
  if (ar == (lua_Debug *)0x0) {
    if (L->top[-1].tt_ == 0x46) {
      pcVar4 = luaF_getlocalname(*(Proto **)(L->top[-1].value_.f + 0x18),n,0);
    }
    else {
      pcVar4 = (char *)0x0;
    }
  }
  else {
    local_20 = (StkId)0x0;
    pcVar4 = findlocal(L,ar->i_ci,n,&local_20);
    if (pcVar4 != (char *)0x0) {
      pTVar1 = L->top;
      iVar2 = local_20->tt_;
      uVar3 = *(undefined4 *)&local_20->field_0xc;
      pTVar1->value_ = local_20->value_;
      pTVar1->tt_ = iVar2;
      *(undefined4 *)&pTVar1->field_0xc = uVar3;
      L->top = L->top + 1;
    }
  }
  swapextra(L);
  return pcVar4;
}

Assistant:

LUA_API const char *lua_getlocal(lua_State *L, const lua_Debug *ar, int n) {
    const char *name;
    lua_lock(L);
    swapextra(L);
    if (ar == NULL) {  /* information about non-active function? */
        if (!isLfunction(L->top - 1))  /* not a Lua function? */
            name = NULL;
        else  /* consider live variables at function start (parameters) */
            name = luaF_getlocalname(clLvalue(L->top - 1)->p, n, 0);
    } else {  /* active function; get information through 'ar' */
        StkId pos = NULL;  /* to avoid warnings */
        name = findlocal(L, ar->i_ci, n, &pos);
        if (name) {
            setobj2s(L, L->top, pos);
            api_incr_top(L);
        }
    }
    swapextra(L);
    lua_unlock(L);
    return name;
}